

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileIO.cpp
# Opt level: O0

ulong base_name(string *filename)

{
  byte bVar1;
  char *pcVar2;
  ulong in_RSI;
  ulong in_RDI;
  size_t i;
  size_t pos;
  long local_20;
  
  bVar1 = std::__cxx11::string::empty();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!filename.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/util/FileIO.cpp"
                  ,0x24,"std::string base_name(const std::string &)");
  }
  local_20 = std::__cxx11::string::size();
  do {
    local_20 = local_20 + -1;
    if (local_20 == 0) break;
    pcVar2 = (char *)std::__cxx11::string::at(in_RSI);
  } while (*pcVar2 != '/');
  std::__cxx11::string::substr(in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

std::string base_name(const std::string& filename) {
  size_t pos = 0;
  assert(!filename.empty());
  for(size_t i = filename.size() - 1; i-- > 0;) {
    if(filename.at(i) == '/') {
      pos = (i + 1);
      break;
    }
  }

  return filename.substr(pos);
}